

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QFontEngine::FaceId,QFreetypeFace*>::emplace<QFreetypeFace*const&>
          (QHash<QFontEngine::FaceId,QFreetypeFace*> *this,FaceId *key,QFreetypeFace **args)

{
  ulong uVar1;
  Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> *pDVar2;
  QFreetypeFace *pQVar3;
  long in_FS_OFFSET;
  piter pVar4;
  QHash<QFontEngine::FaceId,_QFreetypeFace_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QFreetypeFace **)this;
  if (pQVar3 == (QFreetypeFace *)0x0) {
    local_28.d = (Data *)0x0;
LAB_005f9b87:
    pQVar3 = (QFreetypeFace *)0x0;
LAB_005f9ba8:
    pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_>::detached
                       ((Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> *)pQVar3);
    *(Data<QHashPrivate::Node<QFontEngine::FaceId,_QFreetypeFace_*>_> **)this = pDVar2;
  }
  else {
    if (*(uint *)&pQVar3->face < 2) {
      uVar1._0_4_ = pQVar3->xsize;
      uVar1._4_4_ = pQVar3->ysize;
      if (pQVar3->mm_var < (FT_MM_Var *)(uVar1 >> 1)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar4 = (piter)emplace_helper<QFreetypeFace*const&>(this,key,args);
          return (iterator)pVar4;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar4 = (piter)emplace_helper<QFreetypeFace*>(this,key,(QFreetypeFace **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar4;
        }
      }
      goto LAB_005f9c10;
    }
    local_28.d = (Data *)pQVar3;
    if (*(int *)&pQVar3->face != -1) {
      LOCK();
      *(int *)&pQVar3->face = *(int *)&pQVar3->face + 1;
      UNLOCK();
      pQVar3 = *(QFreetypeFace **)this;
      if (pQVar3 == (QFreetypeFace *)0x0) goto LAB_005f9b87;
    }
    if (1 < *(uint *)&pQVar3->face) goto LAB_005f9ba8;
  }
  pVar4 = (piter)emplace_helper<QFreetypeFace*const&>(this,key,args);
  QHash<QFontEngine::FaceId,_QFreetypeFace_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
LAB_005f9c10:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }